

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QRectF>::emplace<QRectF_const&>
          (QMovableArrayOps<QRectF> *this,qsizetype i,QRectF *args)

{
  qsizetype *pqVar1;
  QRectF **ppQVar2;
  qreal *pqVar3;
  Data *pDVar4;
  QRectF *pQVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  qreal qVar11;
  qreal qVar12;
  qreal qVar13;
  qreal qVar14;
  qsizetype qVar15;
  long in_FS_OFFSET;
  bool bVar16;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Inserter local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00588d48:
    qVar11 = args->xp;
    qVar12 = args->yp;
    qVar13 = args->w;
    qVar14 = args->h;
    bVar16 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size != 0;
    QArrayDataPointer<QRectF>::detachAndGrow
              ((QArrayDataPointer<QRectF> *)this,(uint)(i == 0 && bVar16),1,(QRectF **)0x0,
               (QArrayDataPointer<QRectF> *)0x0);
    local_68 = SUB84(qVar13,0);
    uStack_64 = (undefined4)((ulong)qVar13 >> 0x20);
    uStack_60 = SUB84(qVar14,0);
    uStack_5c = (undefined4)((ulong)qVar14 >> 0x20);
    if (i != 0 || !bVar16) {
      Inserter::Inserter(&local_50,(QArrayDataPointer<QRectF> *)this,i,1);
      (local_50.displaceFrom)->xp = qVar11;
      (local_50.displaceFrom)->yp = qVar12;
      *(undefined4 *)&(local_50.displaceFrom)->w = local_68;
      *(undefined4 *)((long)&(local_50.displaceFrom)->w + 4) = uStack_64;
      *(undefined4 *)&(local_50.displaceFrom)->h = uStack_60;
      *(undefined4 *)((long)&(local_50.displaceFrom)->h + 4) = uStack_5c;
      (local_50.data)->size = (local_50.data)->size + local_50.nInserts;
      goto LAB_00588ddd;
    }
    pQVar5 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr;
    pQVar5[-1].xp = qVar11;
    pQVar5[-1].yp = qVar12;
    *(undefined4 *)&pQVar5[-1].w = local_68;
    *(undefined4 *)((long)&pQVar5[-1].w + 4) = uStack_64;
    *(undefined4 *)&pQVar5[-1].h = uStack_60;
    *(undefined4 *)((long)&pQVar5[-1].h + 4) = uStack_5c;
    (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr = pQVar5 + -1;
  }
  else {
    if ((this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size != i) {
LAB_00588d3f:
      if (i == 0) {
        qVar15 = QArrayDataPointer<QRectF>::freeSpaceAtBegin((QArrayDataPointer<QRectF> *)this);
        if (qVar15 != 0) {
          pQVar5 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr;
          uVar7 = *(undefined4 *)&args->xp;
          uVar8 = *(undefined4 *)((long)&args->xp + 4);
          uVar9 = *(undefined4 *)&args->yp;
          uVar10 = *(undefined4 *)((long)&args->yp + 4);
          qVar11 = args->h;
          pQVar5[-1].w = args->w;
          pQVar5[-1].h = qVar11;
          *(undefined4 *)&pQVar5[-1].xp = uVar7;
          *(undefined4 *)((long)&pQVar5[-1].xp + 4) = uVar8;
          *(undefined4 *)&pQVar5[-1].yp = uVar9;
          *(undefined4 *)((long)&pQVar5[-1].yp + 4) = uVar10;
          ppQVar2 = &(this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr;
          *ppQVar2 = *ppQVar2 + -1;
          goto LAB_00588da2;
        }
      }
      goto LAB_00588d48;
    }
    qVar15 = QArrayDataPointer<QRectF>::freeSpaceAtEnd((QArrayDataPointer<QRectF> *)this);
    if (qVar15 == 0) goto LAB_00588d3f;
    pQVar5 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr;
    lVar6 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size;
    uVar7 = *(undefined4 *)&args->xp;
    uVar8 = *(undefined4 *)((long)&args->xp + 4);
    uVar9 = *(undefined4 *)&args->yp;
    uVar10 = *(undefined4 *)((long)&args->yp + 4);
    qVar11 = args->h;
    pqVar3 = &pQVar5[lVar6].w;
    *pqVar3 = args->w;
    pqVar3[1] = qVar11;
    pQVar5 = pQVar5 + lVar6;
    *(undefined4 *)&pQVar5->xp = uVar7;
    *(undefined4 *)((long)&pQVar5->xp + 4) = uVar8;
    *(undefined4 *)&pQVar5->yp = uVar9;
    *(undefined4 *)((long)&pQVar5->yp + 4) = uVar10;
  }
LAB_00588da2:
  pqVar1 = &(this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size;
  *pqVar1 = *pqVar1 + 1;
LAB_00588ddd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }